

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O0

void __thiscall
shaping_clipper::limit_clip_spectrum(shaping_clipper *this,float *clip_spectrum,float *mask_curve)

{
  int *piVar1;
  int iVar2;
  complex<float> *__z;
  float extraout_XMM0_Da;
  float fVar3;
  float extraout_XMM0_Da_00;
  complex<float> local_44;
  float local_3c;
  float local_38;
  float imag;
  float real;
  int local_2c;
  int local_28;
  int bins_below_nyquist;
  int i;
  float relative_distortion_level;
  float *mask_curve_local;
  float *clip_spectrum_local;
  shaping_clipper *this_local;
  
  _i = mask_curve;
  mask_curve_local = clip_spectrum;
  clip_spectrum_local = (float *)this;
  std::abs((int)this);
  bins_below_nyquist = (int)(extraout_XMM0_Da / *_i);
  if (1.0 < (float)bins_below_nyquist) {
    *mask_curve_local = *mask_curve_local / (float)bins_below_nyquist;
  }
  local_28 = 1;
  real = (float)((this->size * this->oversample) / 2);
  imag = (float)(this->size / 2 + 1);
  __z = (complex<float> *)&real;
  piVar1 = std::min<int>((int *)__z,(int *)&imag);
  local_2c = *piVar1;
  for (; local_28 < local_2c; local_28 = local_28 + 1) {
    local_38 = mask_curve_local[local_28 << 1];
    local_3c = mask_curve_local[local_28 * 2 + 1];
    std::complex<float>::complex(&local_44,local_38,local_3c);
    __z = &local_44;
    fVar3 = std::abs<float>(__z);
    bins_below_nyquist = (int)((fVar3 * 2.0) / _i[local_28]);
    if (1.0 < (float)bins_below_nyquist) {
      mask_curve_local[local_28 << 1] = mask_curve_local[local_28 << 1] / (float)bins_below_nyquist;
      iVar2 = local_28 * 2 + 1;
      mask_curve_local[iVar2] = mask_curve_local[iVar2] / (float)bins_below_nyquist;
    }
  }
  if (local_28 == this->size / 2) {
    std::abs((int)__z);
    if (1.0 < extraout_XMM0_Da_00 / _i[this->size / 2]) {
      mask_curve_local[1] = mask_curve_local[1] / (extraout_XMM0_Da_00 / _i[this->size / 2]);
    }
  }
  return;
}

Assistant:

void shaping_clipper::limit_clip_spectrum(float* clip_spectrum, const float* mask_curve) {
    // bin 0
    float relative_distortion_level = std::abs(clip_spectrum[0]) / mask_curve[0];
    if (relative_distortion_level > 1.0) {
        clip_spectrum[0] /= relative_distortion_level;
    }
    // bin 1..N/2-1
    // When oversampling is on, the base nyquist bin is handled in this loop
    int i = 1;
    int bins_below_nyquist = std::min(this->size * this->oversample / 2, this->size / 2 + 1);
    for (; i < bins_below_nyquist; i++) {
        float real = clip_spectrum[i * 2];
        float imag = clip_spectrum[i * 2 + 1];
        // although the negative frequencies are omitted because they are redundant,
        // the magnitude of the positive frequencies are not doubled.
        // Multiply the magnitude by 2 to simulate adding up the + and - frequencies.
        relative_distortion_level = abs(std::complex<float>(real, imag)) * 2 / mask_curve[i];
        if (relative_distortion_level > 1.0) {
            clip_spectrum[i * 2] /= relative_distortion_level;
            clip_spectrum[i * 2 + 1] /= relative_distortion_level;
        }
    }
    // bin N/2
    // When oversampling is off, the base nyquist bins needs to be handled here.
    if (i == this->size / 2) {
        relative_distortion_level = std::abs(clip_spectrum[1]) / mask_curve[this->size / 2];
        if (relative_distortion_level > 1.0) {
            clip_spectrum[1] /= relative_distortion_level;
        }
    }
}